

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaHeat2D_kry.c
# Opt level: O2

void PrintOutput(void *mem,sunrealtype t,N_Vector uu)

{
  int kused;
  undefined8 local_90;
  sunrealtype local_88;
  long nre;
  long nje;
  long nni;
  long nst;
  sunrealtype hused;
  int retval;
  long nps;
  long npe;
  long nli;
  long nreLS;
  
  local_88 = t;
  local_90 = N_VMaxNorm(uu);
  retval = IDAGetLastOrder(mem,&kused);
  check_retval(&retval,"IDAGetLastOrder",1);
  retval = IDAGetNumSteps(mem,&nst);
  check_retval(&retval,"IDAGetNumSteps",1);
  retval = IDAGetNumNonlinSolvIters(mem,&nni);
  check_retval(&retval,"IDAGetNumNonlinSolvIters",1);
  retval = IDAGetNumResEvals(mem,&nre);
  check_retval(&retval,"IDAGetNumResEvals",1);
  retval = IDAGetLastStep(mem,&hused);
  check_retval(&retval,"IDAGetLastStep",1);
  retval = IDAGetNumJtimesEvals(mem,&nje);
  check_retval(&retval,"IDAGetNumJtimesEvals",1);
  retval = IDAGetNumLinIters(mem,&nli);
  check_retval(&retval,"IDAGetNumLinIters",1);
  retval = IDAGetNumLinResEvals(mem,&nreLS);
  check_retval(&retval,"IDAGetNumLinResEvals",1);
  retval = IDAGetNumPrecEvals(mem,&npe);
  check_retval(&retval,"IDAGetNumPrecEvals",1);
  retval = IDAGetNumPrecSolves(mem,&nps);
  check_retval(&retval,"IDAGetNumPrecSolves",1);
  printf(" %5.2f %13.5e  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2e  %3ld %3ld\n",local_88,local_90,
         hused,(ulong)(uint)kused,nst,nni,nje,nre,nreLS,npe,nps);
  return;
}

Assistant:

static void PrintOutput(void* mem, sunrealtype t, N_Vector uu)
{
  sunrealtype hused, umax;
  long int nst, nni, nje, nre, nreLS, nli, npe, nps;
  int kused, retval;

  umax = N_VMaxNorm(uu);

  retval = IDAGetLastOrder(mem, &kused);
  check_retval(&retval, "IDAGetLastOrder", 1);
  retval = IDAGetNumSteps(mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetNumNonlinSolvIters(mem, &nni);
  check_retval(&retval, "IDAGetNumNonlinSolvIters", 1);
  retval = IDAGetNumResEvals(mem, &nre);
  check_retval(&retval, "IDAGetNumResEvals", 1);
  retval = IDAGetLastStep(mem, &hused);
  check_retval(&retval, "IDAGetLastStep", 1);
  retval = IDAGetNumJtimesEvals(mem, &nje);
  check_retval(&retval, "IDAGetNumJtimesEvals", 1);
  retval = IDAGetNumLinIters(mem, &nli);
  check_retval(&retval, "IDAGetNumLinIters", 1);
  retval = IDAGetNumLinResEvals(mem, &nreLS);
  check_retval(&retval, "IDAGetNumLinResEvals", 1);
  retval = IDAGetNumPrecEvals(mem, &npe);
  check_retval(&retval, "IDAGetNumPrecEvals", 1);
  retval = IDAGetNumPrecSolves(mem, &nps);
  check_retval(&retval, "IDAGetNumPrecSolves", 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf(" %5.2Lf %13.5Le  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2Le  %3ld "
         "%3ld\n",
         t, umax, kused, nst, nni, nje, nre, nreLS, hused, npe, nps);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf(" %5.2f %13.5e  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2e  %3ld %3ld\n",
         t, umax, kused, nst, nni, nje, nre, nreLS, hused, npe, nps);
#else
  printf(" %5.2f %13.5e  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2e  %3ld %3ld\n",
         t, umax, kused, nst, nni, nje, nre, nreLS, hused, npe, nps);
#endif
}